

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_subject_entry.cpp
# Opt level: O1

void __thiscall
duckdb::DependencySubjectEntry::DependencySubjectEntry
          (DependencySubjectEntry *this,Catalog *catalog,DependencyInfo *info)

{
  MangledEntryName local_78;
  MangledEntryName local_58;
  MangledDependencyName local_38;
  
  DependencyManager::MangleName(&local_58,(CatalogEntryInfo *)info);
  DependencyManager::MangleName(&local_78,&(info->subject).entry);
  MangledDependencyName::MangledDependencyName(&local_38,&local_58,&local_78);
  DependencyEntry::DependencyEntry(&this->super_DependencyEntry,catalog,SUBJECT,&local_38,info);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.name._M_dataplus._M_p != &local_38.name.field_2) {
    operator_delete(local_38.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != &local_58.name.field_2) {
    operator_delete(local_58.name._M_dataplus._M_p);
  }
  (this->super_DependencyEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)&PTR__DependencyDependentEntry_0249dc68;
  return;
}

Assistant:

DependencySubjectEntry::DependencySubjectEntry(Catalog &catalog, const DependencyInfo &info)
    : DependencyEntry(catalog, DependencyEntryType::SUBJECT,
                      MangledDependencyName(DependencyManager::MangleName(info.dependent.entry),
                                            DependencyManager::MangleName(info.subject.entry)),
                      info) {
}